

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BitmapIndexBuilder::get_run(BitmapIndexBuilder *this,TriGram val)

{
  byte *pbVar1;
  int in_EDX;
  long in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  int shift;
  int offset;
  uint32_t run_start;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  value_type_conflict3 *in_stack_ffffffffffffffa8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined4 local_24;
  undefined4 local_20;
  
  this_00 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1be73e);
  for (local_20 = 0; local_20 < 1; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 0x10),
                          (ulong)(uint)(in_EDX + local_20));
      if (((uint)*pbVar1 & 1 << ((byte)local_24 & 0x1f)) != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_00,in_stack_ffffffffffffffa8);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<FileId> BitmapIndexBuilder::get_run(TriGram val) const {
    uint32_t run_start = file_run_size * val;
    std::vector<FileId> result;
    for (int offset = 0; offset < file_run_size; offset++) {
        for (int shift = 0; shift < 8; shift++) {
            if ((raw_data[run_start + offset] & (1 << shift)) != 0) {
                result.push_back(offset * 8 + shift);
            }
        }
    }
    return result;
}